

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

QList<QCss::StyleRule> * __thiscall
QCss::StyleSelector::styleRulesForNode
          (QList<QCss::StyleRule> *__return_storage_ptr__,StyleSelector *this,NodePtr node)

{
  StyleSheet *pSVar1;
  MediaRule *pMVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  undefined1 *puVar7;
  _Rb_tree_node_base *p_Var8;
  ulong uVar9;
  _Rb_tree_node_base *p_Var10;
  long lVar11;
  size_t asize;
  int j;
  long lVar12;
  ulong uVar13;
  int i;
  ulong uVar14;
  QString *key;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QString> local_58;
  QMultiMap<unsigned_int,_QCss::StyleRule> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (StyleRule *)0x0;
  uVar14 = (this->styleSheets).d.size;
  if (uVar14 != 0) {
    local_40.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
            )0x0;
    for (uVar9 = 0; uVar9 < uVar14; uVar9 = uVar9 + 1) {
      pSVar1 = (this->styleSheets).d.ptr;
      lVar12 = 0;
      for (uVar14 = 0; uVar14 < (ulong)pSVar1[uVar9].styleRules.d.size; uVar14 = uVar14 + 1) {
        matchRule(this,node,
                  (StyleRule *)((long)&((pSVar1[uVar9].styleRules.d.ptr)->selectors).d.d + lVar12),
                  pSVar1[uVar9].origin,pSVar1[uVar9].depth,&local_40);
        lVar12 = lVar12 + 0x38;
      }
      if (pSVar1[uVar9].idIndex.m_size != 0) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d._0_4_ = 0xaaaaaaaa;
        local_58.d._4_4_ = 0xaaaaaaaa;
        local_58.ptr._0_4_ = 0xaaaaaaaa;
        local_58.ptr._4_4_ = 0xaaaaaaaa;
        (*this->_vptr_StyleSelector[5])(&local_58,this,node.ptr);
        for (puVar7 = (undefined1 *)0x0; puVar7 < (ulong)local_58.size; puVar7 = puVar7 + 1) {
          key = (QString *)((long)puVar7 * 0x18 + CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_));
          local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QMultiHash<QString,_QCss::StyleRule>::constFindImpl<QString>
                    ((const_iterator *)&local_78,&pSVar1[uVar9].idIndex,key);
          while ((undefined8 *)local_78.size != (undefined8 *)0x0) {
            bVar6 = ::comparesEqual((QString *)
                                    (*(long *)(*(long *)&local_78.d[2].super_QArrayData +
                                               ((ulong)local_78.ptr >> 7) * 0x90 + 0x80) +
                                    (ulong)*(byte *)(*(long *)&local_78.d[2].super_QArrayData +
                                                     ((ulong)local_78.ptr >> 7) * 0x90 +
                                                    (ulong)((uint)local_78.ptr & 0x7f)) * 0x20),key)
            ;
            if (!bVar6) break;
            matchRule(this,node,*(StyleRule **)local_78.size,pSVar1[uVar9].origin,
                      pSVar1[uVar9].depth,&local_40);
            QMultiHash<QString,_QCss::StyleRule>::const_iterator::operator++
                      ((const_iterator *)&local_78);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      }
      if (pSVar1[uVar9].nameIndex.m_size != 0) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d._0_4_ = 0xaaaaaaaa;
        local_58.d._4_4_ = 0xaaaaaaaa;
        local_58.ptr._0_4_ = 0xaaaaaaaa;
        local_58.ptr._4_4_ = 0xaaaaaaaa;
        (*this->_vptr_StyleSelector[6])(&local_58,this,node.ptr);
        for (puVar7 = (undefined1 *)0x0; puVar7 < (ulong)local_58.size; puVar7 = puVar7 + 1) {
          lVar12 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
          lVar11 = (long)puVar7 * 0x18;
          local_78.d = *(Data **)(lVar12 + lVar11);
          local_78.ptr = *(char16_t **)(lVar12 + 8 + lVar11);
          local_78.size = *(undefined8 *)(lVar12 + 0x10 + lVar11);
          if (local_78.d != (Data *)0x0) {
            LOCK();
            ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (this->nameCaseSensitivity == CaseInsensitive) {
            QString::toLower_helper((QString *)&local_98);
            qVar5 = local_78.size;
            pcVar4 = local_78.ptr;
            pDVar3 = local_78.d;
            local_78.d = local_98.d;
            local_78.ptr = local_98.ptr;
            local_98.d = pDVar3;
            local_98.ptr = pcVar4;
            local_78.size = local_98.size;
            local_98.size = qVar5;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          }
          local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QMultiHash<QString,_QCss::StyleRule>::constFindImpl<QString>
                    ((const_iterator *)&local_98,&pSVar1[uVar9].nameIndex,(QString *)&local_78);
          while ((undefined8 *)local_98.size != (undefined8 *)0x0) {
            bVar6 = ::comparesEqual((QString *)
                                    (*(long *)(*(long *)&local_98.d[2].super_QArrayData +
                                               ((ulong)local_98.ptr >> 7) * 0x90 + 0x80) +
                                    (ulong)*(byte *)(*(long *)&local_98.d[2].super_QArrayData +
                                                     ((ulong)local_98.ptr >> 7) * 0x90 +
                                                    (ulong)((uint)local_98.ptr & 0x7f)) * 0x20),
                                    (QString *)&local_78);
            if (!bVar6) break;
            matchRule(this,node,*(StyleRule **)local_98.size,pSVar1[uVar9].origin,
                      pSVar1[uVar9].depth,&local_40);
            QMultiHash<QString,_QCss::StyleRule>::const_iterator::operator++
                      ((const_iterator *)&local_98);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      }
      if ((this->medium).d.size != 0) {
        for (uVar14 = 0; uVar14 < (ulong)pSVar1[uVar9].mediaRules.d.size; uVar14 = uVar14 + 1) {
          bVar6 = QListSpecialMethods<QString>::contains
                            ((QListSpecialMethods<QString> *)
                             (pSVar1[uVar9].mediaRules.d.ptr + uVar14),&this->medium,CaseInsensitive
                            );
          if (bVar6) {
            lVar12 = 0;
            for (uVar13 = 0; pMVar2 = pSVar1[uVar9].mediaRules.d.ptr,
                uVar13 < (ulong)pMVar2[uVar14].styleRules.d.size; uVar13 = uVar13 + 1) {
              matchRule(this,node,
                        (StyleRule *)
                        ((long)&((pMVar2[uVar14].styleRules.d.ptr)->selectors).d.d + lVar12),
                        pSVar1[uVar9].origin,pSVar1[uVar9].depth,&local_40);
              lVar12 = lVar12 + 0x38;
            }
          }
        }
      }
      uVar14 = (this->styleSheets).d.size;
    }
    if (local_40.d.d.ptr ==
        (totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
         )0x0) {
      asize = 0;
    }
    else {
      asize = *(size_t *)((long)local_40.d.d.ptr + 0x30);
    }
    QList<QCss::StyleRule>::reserve(__return_storage_ptr__,asize);
    if (local_40.d.d.ptr ==
        (totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
         )0x0) {
      p_Var8 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var8 = *(_Base_ptr *)((long)local_40.d.d.ptr + 0x20);
    }
    while( true ) {
      p_Var10 = (_Rb_tree_node_base *)((long)local_40.d.d.ptr + 0x10);
      if (local_40.d.d.ptr ==
          (totally_ordered_wrapper<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_*>
           )0x0) {
        p_Var10 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var8 == p_Var10) break;
      QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
                (__return_storage_ptr__,(StyleRule *)&p_Var8[1]._M_parent);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<unsigned_int,_QCss::StyleRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QCss::StyleRule>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_40.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<StyleRule> StyleSelector::styleRulesForNode(NodePtr node)
{
    QList<StyleRule> rules;
    if (styleSheets.isEmpty())
        return rules;

    QMultiMap<uint, StyleRule> weightedRules; // (spec, rule) that will be sorted below

    //prune using indexed stylesheet
    for (int sheetIdx = 0; sheetIdx < styleSheets.size(); ++sheetIdx) {
        const StyleSheet &styleSheet = styleSheets.at(sheetIdx);
        for (int i = 0; i < styleSheet.styleRules.size(); ++i) {
            matchRule(node, styleSheet.styleRules.at(i), styleSheet.origin, styleSheet.depth, &weightedRules);
        }

        if (!styleSheet.idIndex.isEmpty()) {
            QStringList ids = nodeIds(node);
            for (int i = 0; i < ids.size(); i++) {
                const QString &key = ids.at(i);
                QMultiHash<QString, StyleRule>::const_iterator it = styleSheet.idIndex.constFind(key);
                while (it != styleSheet.idIndex.constEnd() && it.key() == key) {
                    matchRule(node, it.value(), styleSheet.origin, styleSheet.depth, &weightedRules);
                    ++it;
                }
            }
        }
        if (!styleSheet.nameIndex.isEmpty()) {
            QStringList names = nodeNames(node);
            for (int i = 0; i < names.size(); i++) {
                QString name = names.at(i);
                if (nameCaseSensitivity == Qt::CaseInsensitive)
                    name = std::move(name).toLower();
                QMultiHash<QString, StyleRule>::const_iterator it = styleSheet.nameIndex.constFind(name);
                while (it != styleSheet.nameIndex.constEnd() && it.key() == name) {
                    matchRule(node, it.value(), styleSheet.origin, styleSheet.depth, &weightedRules);
                    ++it;
                }
            }
        }
        if (!medium.isEmpty()) {
            for (int i = 0; i < styleSheet.mediaRules.size(); ++i) {
                if (styleSheet.mediaRules.at(i).media.contains(medium, Qt::CaseInsensitive)) {
                    for (int j = 0; j < styleSheet.mediaRules.at(i).styleRules.size(); ++j) {
                        matchRule(node, styleSheet.mediaRules.at(i).styleRules.at(j), styleSheet.origin,
                               styleSheet.depth, &weightedRules);
                    }
                }
            }
        }
    }

    rules.reserve(weightedRules.size());
    QMultiMap<uint, StyleRule>::const_iterator it = weightedRules.constBegin();
    for ( ; it != weightedRules.constEnd() ; ++it)
        rules += *it;

    return rules;
}